

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QRect __thiscall QDockAreaLayout::separatorRect(QDockAreaLayout *this,int index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  QRect QVar11;
  
  uVar9 = 0;
  uVar7 = 0;
  lVar8 = 0;
  do {
    uVar10 = 0xffffffff;
    if ((ulong)this->docks[index].item_list.d.size <= uVar7) goto LAB_003fd525;
    bVar4 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&(this->docks[index].item_list.d.ptr)->widgetItem + lVar8));
    lVar8 = lVar8 + 0x28;
    uVar7 = uVar7 + 1;
  } while (bVar4);
  if (lVar8 == 0) {
LAB_003fd525:
    uVar5 = 0xffffffff;
    uVar6 = 0;
  }
  else {
    uVar5 = 0xffffffff;
    uVar6 = 0;
    if ((uint)index < 4) {
      uVar1 = this->docks[index].rect.x1.m_i;
      uVar2 = this->docks[index].rect.y1.m_i;
      uVar9 = (ulong)uVar2;
      uVar5 = this->docks[index].rect.x2.m_i;
      uVar3 = this->docks[index].rect.y2.m_i;
      uVar10 = (ulong)uVar3;
      uVar6 = uVar1;
      switch(index) {
      case 0:
        uVar6 = uVar5 + 1;
        uVar5 = uVar5 + this->sep;
        break;
      case 1:
        uVar6 = uVar1 - this->sep;
        uVar5 = uVar1 - 1;
        break;
      case 2:
        uVar9 = (ulong)(uVar3 + 1);
        uVar10 = (ulong)(uVar3 + this->sep);
        break;
      case 3:
        uVar10 = (ulong)(uVar2 - 1);
        uVar9 = (ulong)(uVar2 - this->sep);
      }
    }
  }
  QVar11._0_8_ = (ulong)uVar6 | uVar9 << 0x20;
  QVar11._8_8_ = (ulong)uVar5 | uVar10 << 0x20;
  return QVar11;
}

Assistant:

QRect QDockAreaLayout::separatorRect(int index) const
{
    const QDockAreaLayoutInfo &dock = docks[index];
    if (dock.isEmpty())
        return QRect();
    QRect r = dock.rect;
    switch (index) {
        case QInternal::LeftDock:
            return QRect(r.right() + 1, r.top(), sep, r.height());
        case QInternal::RightDock:
            return QRect(r.left() - sep, r.top(), sep, r.height());
        case QInternal::TopDock:
            return QRect(r.left(), r.bottom() + 1, r.width(), sep);
        case QInternal::BottomDock:
            return QRect(r.left(), r.top() - sep, r.width(), sep);
        default:
            break;
    }
    return QRect();
}